

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void raw_enqueue_event(CManager_conflict cm,queue_ptr queue,event_item *event)

{
  queue_item *pqVar1;
  
  pqVar1 = cm->evp->queue_items_free_list;
  if (pqVar1 == (queue_item *)0x0) {
    pqVar1 = (queue_item *)INT_CMmalloc(0x18);
  }
  else {
    cm->evp->queue_items_free_list = pqVar1->next;
  }
  pqVar1->item = event;
  pqVar1->handled = 0;
  event->ref_count = event->ref_count + 1;
  if (queue->queue_head == (queue_item *)0x0) {
    queue->queue_head = pqVar1;
  }
  else {
    queue->queue_tail->next = pqVar1;
  }
  queue->queue_tail = pqVar1;
  pqVar1->next = (queue_item *)0x0;
  return;
}

Assistant:

static void
raw_enqueue_event(CManager cm, queue_ptr queue, event_item *event)
{
    queue_item *item;
    event_path_data evp = cm->evp;
    if (evp->queue_items_free_list == NULL) {
	item = malloc(sizeof(*item));
    } else {
	item = evp->queue_items_free_list;
	evp->queue_items_free_list = item->next;
    }
    item->item = event;
    item->handled = 0;
    reference_event(event);
    if (queue->queue_head == NULL) {
	queue->queue_head = item;
	queue->queue_tail = item;
	item->next = NULL;
    } else {
	queue->queue_tail->next = item;
	queue->queue_tail = item;
	item->next = NULL;
    }
}